

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChRoundedBox.cpp
# Opt level: O1

void __thiscall
chrono::geometry::ChRoundedBox::GetBoundingBox
          (ChRoundedBox *this,ChVector<double> *cmin,ChVector<double> *cmax,ChMatrix33<double> *rot)

{
  double dVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  pointer pCVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  initializer_list<chrono::ChVector<double>_> __l;
  vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_> vertices;
  allocator_type local_f9;
  vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_> local_f8;
  ChVector<double> local_e0;
  undefined8 local_c8;
  double local_c0;
  double local_b8;
  undefined1 local_b0 [16];
  double local_a0;
  double local_98;
  undefined8 local_90;
  double local_88;
  double local_80;
  double local_78;
  undefined1 local_70 [16];
  double local_60;
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  double local_38;
  undefined1 local_30 [16];
  
  local_e0.m_data[0] = (this->Size).m_data[0];
  local_e0.m_data[1] = (this->Size).m_data[1];
  local_e0.m_data[2] = (this->Size).m_data[2];
  auVar20._0_8_ = -local_e0.m_data[0];
  auVar20._8_8_ = 0x8000000000000000;
  local_c8 = vmovlpd_avx(auVar20);
  auVar22._0_8_ = -local_e0.m_data[1];
  auVar22._8_8_ = -local_e0.m_data[1];
  local_b0 = vunpcklpd_avx(auVar20,auVar22);
  local_90 = vmovlpd_avx(auVar22);
  auVar15._0_8_ = -local_e0.m_data[2];
  auVar15._8_8_ = 0x8000000000000000;
  local_70 = vunpcklpd_avx(auVar15,auVar20);
  local_48 = vunpcklpd_avx(auVar22,auVar15);
  __l._M_len = 8;
  __l._M_array = &local_e0;
  local_c0 = local_e0.m_data[1];
  local_b8 = local_e0.m_data[2];
  local_a0 = local_e0.m_data[2];
  local_98 = local_e0.m_data[0];
  local_88 = local_e0.m_data[2];
  local_80 = local_e0.m_data[0];
  local_78 = local_e0.m_data[1];
  local_60 = local_e0.m_data[1];
  local_58 = local_70;
  local_38 = local_e0.m_data[0];
  local_30 = local_48;
  std::vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>::vector
            (&local_f8,__l,&local_f9);
  cmin->m_data[0] = 1.79769313486232e+308;
  cmin->m_data[1] = 1.79769313486232e+308;
  cmin->m_data[2] = 1.79769313486232e+308;
  cmax->m_data[0] = -1.79769313486232e+308;
  cmax->m_data[1] = -1.79769313486232e+308;
  cmax->m_data[2] = -1.79769313486232e+308;
  for (pCVar8 = local_f8.
                super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pCVar8 != local_f8.
                super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
                ._M_impl.super__Vector_impl_data._M_finish; pCVar8 = pCVar8 + 1) {
    auVar9._8_8_ = 0;
    auVar9._0_8_ = pCVar8->m_data[0];
    dVar1 = pCVar8->m_data[1];
    auVar2._8_8_ = 0;
    auVar2._0_8_ = (rot->super_Matrix<double,_3,_3,_1,_3,_3>).
                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                   array[0];
    auVar16._8_8_ = 0;
    auVar16._0_8_ =
         dVar1 * (rot->super_Matrix<double,_3,_3,_1,_3,_3>).
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [3];
    auVar15 = vfmadd231sd_fma(auVar16,auVar9,auVar2);
    auVar17._8_8_ = 0;
    auVar17._0_8_ = pCVar8->m_data[2];
    auVar3._8_8_ = 0;
    auVar3._0_8_ = (rot->super_Matrix<double,_3,_3,_1,_3,_3>).
                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                   array[6];
    auVar20 = vfmadd231sd_fma(auVar15,auVar17,auVar3);
    auVar4._8_8_ = 0;
    auVar4._0_8_ = (rot->super_Matrix<double,_3,_3,_1,_3,_3>).
                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                   array[1];
    auVar21._8_8_ = 0;
    auVar21._0_8_ =
         dVar1 * (rot->super_Matrix<double,_3,_3,_1,_3,_3>).
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [4];
    auVar15 = vfmadd231sd_fma(auVar21,auVar9,auVar4);
    auVar5._8_8_ = 0;
    auVar5._0_8_ = (rot->super_Matrix<double,_3,_3,_1,_3,_3>).
                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                   array[7];
    auVar22 = vfmadd231sd_fma(auVar15,auVar17,auVar5);
    auVar6._8_8_ = 0;
    auVar6._0_8_ = (rot->super_Matrix<double,_3,_3,_1,_3,_3>).
                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                   array[2];
    auVar14._8_8_ = 0;
    auVar14._0_8_ =
         dVar1 * (rot->super_Matrix<double,_3,_3,_1,_3,_3>).
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [5];
    auVar15 = vfmadd231sd_fma(auVar14,auVar9,auVar6);
    auVar7._8_8_ = 0;
    auVar7._0_8_ = (rot->super_Matrix<double,_3,_3,_1,_3,_3>).
                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                   array[8];
    auVar2 = vfmadd231sd_fma(auVar15,auVar17,auVar7);
    auVar10._8_8_ = 0;
    auVar10._0_8_ = cmin->m_data[0];
    auVar18._8_8_ = 0;
    auVar18._0_8_ = cmin->m_data[1];
    auVar15 = vminsd_avx(auVar10,auVar20);
    cmin->m_data[0] = auVar15._0_8_;
    auVar15 = vminsd_avx(auVar18,auVar22);
    cmin->m_data[1] = auVar15._0_8_;
    auVar11._8_8_ = 0;
    auVar11._0_8_ = cmin->m_data[2];
    auVar15 = vminsd_avx(auVar11,auVar2);
    cmin->m_data[2] = auVar15._0_8_;
    auVar12._8_8_ = 0;
    auVar12._0_8_ = cmax->m_data[0];
    auVar19._8_8_ = 0;
    auVar19._0_8_ = cmax->m_data[1];
    auVar15 = vmaxsd_avx(auVar12,auVar20);
    cmax->m_data[0] = auVar15._0_8_;
    auVar15 = vmaxsd_avx(auVar19,auVar22);
    cmax->m_data[1] = auVar15._0_8_;
    auVar13._8_8_ = 0;
    auVar13._0_8_ = cmax->m_data[2];
    auVar15 = vmaxsd_avx(auVar13,auVar2);
    cmax->m_data[2] = auVar15._0_8_;
  }
  if (local_f8.
      super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_f8.
                    super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_f8.
                          super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_f8.
                          super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void ChRoundedBox::GetBoundingBox(ChVector<>& cmin, ChVector<>& cmax, const ChMatrix33<>& rot) const {
    std::vector<ChVector<>> vertices{GetP1(), GetP2(), GetP3(), GetP4(), GetP5(), GetP6(), GetP7(), GetP8()};

    cmin = ChVector<>(+std::numeric_limits<double>::max());
    cmax = ChVector<>(-std::numeric_limits<double>::max());

    for (const auto& v : vertices) {
        auto p = rot.transpose() * v;

        cmin.x() = ChMin(cmin.x(), p.x());
        cmin.y() = ChMin(cmin.y(), p.y());
        cmin.z() = ChMin(cmin.z(), p.z());

        cmax.x() = ChMax(cmax.x(), p.x());
        cmax.y() = ChMax(cmax.y(), p.y());
        cmax.z() = ChMax(cmax.z(), p.z());
    }
}